

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O1

void duckdb::ForceCompressionSetting::SetGlobal(DatabaseInstance *db,DBConfig *config,Value *input)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CompressionType compression_type;
  bool bVar2;
  int iVar3;
  ParserException *pPVar4;
  CompressionType type;
  string compression_types;
  string compression;
  string local_e8;
  string local_c8;
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  Value::ToString_abi_cxx11_(&local_e8,input);
  StringUtil::Lower(&local_a8,(string *)&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  iVar3 = ::std::__cxx11::string::compare((char *)&local_a8);
  if (iVar3 != 0) {
    iVar3 = ::std::__cxx11::string::compare((char *)&local_a8);
    if (iVar3 != 0) {
      compression_type = CompressionTypeFromString((string *)&local_a8);
      bVar2 = CompressionTypeIsDeprecated(compression_type);
      if (bVar2) {
        pPVar4 = (ParserException *)__cxa_allocate_exception(0x10);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e8,"Attempted to force a deprecated compression type (%s)","");
        CompressionTypeToString_abi_cxx11_(&local_50,(duckdb *)(ulong)compression_type,type);
        ParserException::ParserException<std::__cxx11::string>(pPVar4,&local_e8,&local_50);
        __cxa_throw(pPVar4,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (compression_type == COMPRESSION_AUTO) {
        ListCompressionTypes_abi_cxx11_();
        paVar1 = &local_c8.field_2;
        local_c8._M_dataplus._M_p = (pointer)paVar1;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,", ","");
        StringUtil::Join((string *)&local_e8,&local_88,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_88);
        pPVar4 = (ParserException *)__cxa_allocate_exception(0x10);
        local_c8._M_dataplus._M_p = (pointer)paVar1;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8,
                   "Unrecognized option for PRAGMA force_compression, expected %s","");
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,local_e8._M_dataplus._M_p,
                   local_e8._M_dataplus._M_p + local_e8._M_string_length);
        ParserException::ParserException<std::__cxx11::string>(pPVar4,(string *)&local_c8,&local_70)
        ;
        __cxa_throw(pPVar4,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      goto LAB_0165feea;
    }
  }
  compression_type = COMPRESSION_AUTO;
LAB_0165feea:
  (config->options).force_compression = compression_type;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ForceCompressionSetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	auto compression = StringUtil::Lower(input.ToString());
	if (compression == "none" || compression == "auto") {
		config.options.force_compression = CompressionType::COMPRESSION_AUTO;
	} else {
		auto compression_type = CompressionTypeFromString(compression);
		if (CompressionTypeIsDeprecated(compression_type)) {
			throw ParserException("Attempted to force a deprecated compression type (%s)",
			                      CompressionTypeToString(compression_type));
		}
		if (compression_type == CompressionType::COMPRESSION_AUTO) {
			auto compression_types = StringUtil::Join(ListCompressionTypes(), ", ");
			throw ParserException("Unrecognized option for PRAGMA force_compression, expected %s", compression_types);
		}
		config.options.force_compression = compression_type;
	}
}